

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

TPZFlopCounter __thiscall
TPZMatrix<TPZFlopCounter>::ConditionNumber
          (TPZMatrix<TPZFlopCounter> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  TPZFlopCounter TVar3;
  TPZFlopCounter TVar4;
  TPZFMatrix<TPZFlopCounter> Inv;
  REAL local_b8;
  TPZFMatrix<TPZFlopCounter> local_a8;
  
  TPZFMatrix<TPZFlopCounter>::TPZFMatrix(&local_a8);
  TVar3 = MatrixNorm(this,p,numiter,tol);
  iVar1 = Inverse(this,&local_a8,ENoDecompose);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<TPZFlopCounter>::ConditionNumber(int, int64_t, REAL) [T = TPZFlopCounter]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    local_b8 = 0.0;
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    TVar4 = MatrixNorm(&local_a8.super_TPZMatrix<TPZFlopCounter>,p,numiter,tol);
    local_b8 = TVar3.fVal * TVar4.fVal;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
  }
  TPZFMatrix<TPZFlopCounter>::~TPZFMatrix(&local_a8);
  return (TPZFlopCounter)local_b8;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}